

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDCircles.cpp
# Opt level: O1

void __thiscall AngleSet::computeStartEndTheta(AngleSet *this,double *sTheta,double *eTheta)

{
  AngleSetArc *pAVar1;
  double dVar2;
  int iVar3;
  uint uVar4;
  double dVar5;
  ulong uVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  
  iVar3 = this->head;
  pAVar1 = this->angles + iVar3;
  uVar6 = (ulong)pAVar1->next;
  if ((long)uVar6 < 0) {
    *sTheta = pAVar1->sTheta;
    dVar8 = this->angles[iVar3].eTheta;
  }
  else {
    dVar8 = pAVar1->eTheta;
    dVar2 = this->angles[uVar6].sTheta;
    uVar4 = this->angles[uVar6].next;
    dVar5 = dVar2 - dVar8;
    while (-1 < (int)uVar4) {
      dVar9 = this->angles[uVar6].eTheta;
      uVar6 = (ulong)uVar4;
      dVar10 = this->angles[uVar6].sTheta;
      dVar7 = dVar10 - dVar9;
      if (dVar7 <= dVar5) {
        dVar10 = dVar2;
      }
      dVar8 = (double)(~-(ulong)(dVar5 < dVar7) & (ulong)dVar8 |
                      (ulong)dVar9 & -(ulong)(dVar5 < dVar7));
      if (dVar7 <= dVar5) {
        dVar7 = dVar5;
      }
      dVar2 = dVar10;
      dVar5 = dVar7;
      uVar4 = this->angles[uVar6].next;
    }
    dVar9 = this->angles[uVar6].eTheta;
    dVar10 = (6.283185307179586 - dVar9) + pAVar1->sTheta;
    uVar6 = -(ulong)(dVar5 < dVar10);
    dVar8 = (double)(~uVar6 & (ulong)dVar8 | (ulong)dVar9 & uVar6);
    dVar9 = pAVar1->sTheta;
    if (dVar10 <= dVar5) {
      dVar9 = dVar2;
    }
    *sTheta = dVar9;
  }
  *eTheta = dVar8;
  return;
}

Assistant:

void AngleSet::computeStartEndTheta(double & sTheta, double & eTheta)
{
	// Special case: Just one arc
	if (angles[head].next < 0) {
		sTheta = angles[head].sTheta;
		eTheta = angles[head].eTheta;

		return;
	} //end-if

	  // OK. More than one arc. Find the biggest gap
	int current = head;
	int nextArc = angles[current].next;

	double biggestGapSTheta = angles[current].eTheta;
	double biggestGapEtheta = angles[nextArc].sTheta;
	double biggestGapLength = biggestGapEtheta - biggestGapSTheta;

	double start, end, len;
	while (1) {
		current = nextArc;
		nextArc = angles[nextArc].next;
		if (nextArc < 0) break;

		start = angles[current].eTheta;
		end = angles[nextArc].sTheta;
		len = end - start;

		if (len > biggestGapLength) {
			biggestGapSTheta = start;
			biggestGapEtheta = end;
			biggestGapLength = len;
		} //end-if

	} //end-while

	  // Compute the gap between the last arc & the first arc
	start = angles[current].eTheta;
	end = angles[head].sTheta;
	len = TWOPI - start + end;
	if (len > biggestGapLength) {
		biggestGapSTheta = start;
		biggestGapEtheta = end;
	} //end-if

	sTheta = biggestGapEtheta;
	eTheta = biggestGapSTheta;
}